

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::permuteTest<false>(ViewTest *this)

{
  int iVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_02;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_03;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_04;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_05;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_06;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_07;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_08;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_09;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_10;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_11;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_12;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_13;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_14;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_15;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_16;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_17;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_18;
  reference piVar2;
  size_t x_2;
  int *data;
  size_t y;
  size_t sVar3;
  size_t sVar4;
  size_t x_1;
  size_t y_2;
  size_t x;
  size_t sVar5;
  allocator_type local_1e9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> permutation_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  View<int,_false,_std::allocator<unsigned_long>_> w2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> permutation;
  View<int,_false,_std::allocator<unsigned_long>_> w1;
  View<int,_false,_std::allocator<unsigned_long>_> w5;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  begin_09._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_09._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_09._M_current = 6;
  begin_09._M_current[1] = 4;
  data = this->data_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_09,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w1);
  begin_10._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_10._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w1,begin_10,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w2);
  begin_11._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_11._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w2,begin_11,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&permutation);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&permutation,2,(allocator_type *)&w5);
  begin_15._M_current._4_4_ =
       permutation.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_15._M_current._0_4_ =
       permutation.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_15._M_current = 1;
  begin_15._M_current[1] = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w1,begin_15);
  begin_16._M_current._4_4_ =
       permutation.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_16._M_current._0_4_ =
       permutation.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_16._M_current = 0;
  begin_16._M_current[1] = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w2,begin_16);
  for (sVar5 = 0; sVar5 != 6; sVar5 = sVar5 + 1) {
    for (sVar3 = 0; sVar3 != 4; sVar3 = sVar3 + 1) {
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar5,sVar3);
      iVar1 = *piVar2;
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&w1,sVar3,sVar5);
      w5.data_._0_1_ = iVar1 == *piVar2;
      test((bool *)&w5);
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar5,sVar3);
      iVar1 = *piVar2;
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&w2,sVar5,sVar3);
      w5.data_._0_1_ = iVar1 == *piVar2;
      test((bool *)&w5);
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&permutation);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w2.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w1.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  begin_12._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_12._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_12._M_current = 6;
  begin_12._M_current[1] = 4;
  w1.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_12,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w1,&andres::defaultOrder,
             (allocator_type *)&w2);
  begin_13._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_13._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  w2.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w1,begin_13,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w2,&andres::defaultOrder,
             (allocator_type *)&permutation);
  begin_14._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_14._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  permutation.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w2,begin_14,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&permutation,
             &andres::defaultOrder,(allocator_type *)&w5);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&permutation,2,(allocator_type *)&w5);
  begin_17._M_current._4_4_ =
       permutation.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_17._M_current._0_4_ =
       permutation.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_17._M_current = 1;
  begin_17._M_current[1] = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w1,begin_17);
  begin_18._M_current._4_4_ =
       permutation.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_18._M_current._0_4_ =
       permutation.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_18._M_current = 0;
  begin_18._M_current[1] = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w2,begin_18);
  for (sVar5 = 0; sVar5 != 6; sVar5 = sVar5 + 1) {
    for (sVar3 = 0; sVar3 != 4; sVar3 = sVar3 + 1) {
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar5,sVar3);
      iVar1 = *piVar2;
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&w1,sVar3,sVar5);
      w5.data_._0_1_ = iVar1 == *piVar2;
      test((bool *)&w5);
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar5,sVar3);
      iVar1 = *piVar2;
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&w2,sVar5,sVar3);
      w5.data_._0_1_ = iVar1 == *piVar2;
      test((bool *)&w5);
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&permutation);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w2.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w1.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&shape);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,3,(allocator_type *)&v);
  *shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w1,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w2);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w2,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&shape);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&shape,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&permutation);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&permutation,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w5);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&permutation_2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&permutation_2,3,&local_1e9);
  begin._M_current._4_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin._M_current._0_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin._M_current = 0;
  begin._M_current[1] = 1;
  begin._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w1,begin);
  begin_00._M_current._4_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_00._M_current._0_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_00._M_current = 1;
  begin_00._M_current[1] = 0;
  begin_00._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w2,begin_00);
  begin_01._M_current._4_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_01._M_current._0_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_01._M_current = 0;
  begin_01._M_current[1] = 2;
  begin_01._M_current[2] = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&shape,begin_01);
  begin_02._M_current._4_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_02._M_current._0_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_02._M_current = 2;
  begin_02._M_current[1] = 1;
  begin_02._M_current[2] = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&permutation,begin_02);
  begin_03._M_current._4_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_03._M_current._0_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_03._M_current = 1;
  begin_03._M_current[1] = 2;
  begin_03._M_current[2] = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w5,begin_03);
  for (sVar5 = 0; sVar5 != 3; sVar5 = sVar5 + 1) {
    for (sVar3 = 0; sVar3 != 4; sVar3 = sVar3 + 1) {
      for (sVar4 = 0; sVar4 != 2; sVar4 = sVar4 + 1) {
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar5,sVar3,sVar4);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&w1,sVar5,sVar3,sVar4);
        local_1e9 = (allocator_type)(iVar1 == *piVar2);
        test((bool *)&local_1e9);
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar5,sVar3,sVar4);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&w2,sVar3,sVar5,sVar4);
        local_1e9 = (allocator_type)(iVar1 == *piVar2);
        test((bool *)&local_1e9);
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar5,sVar3,sVar4);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&shape,sVar5,sVar4,
                            sVar3);
        local_1e9 = (allocator_type)(iVar1 == *piVar2);
        test((bool *)&local_1e9);
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar5,sVar3,sVar4);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&permutation,sVar4,
                            sVar3,sVar5);
        local_1e9 = (allocator_type)(iVar1 == *piVar2);
        test((bool *)&local_1e9);
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar5,sVar3,sVar4);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&w5,sVar3,sVar4,sVar5);
        local_1e9 = (allocator_type)(iVar1 == *piVar2);
        test((bool *)&local_1e9);
      }
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&permutation_2);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w5.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)
             &permutation.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)
             &shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w2.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w1.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,3,(allocator_type *)&v);
  *shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  w1.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w1,&andres::defaultOrder,
             (allocator_type *)&w2);
  w2.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w1,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w2,&andres::defaultOrder,
             (allocator_type *)&shape);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w2,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&shape,
             &andres::defaultOrder,(allocator_type *)&permutation);
  permutation.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&shape,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&permutation,
             &andres::defaultOrder,(allocator_type *)&w5);
  w5.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&permutation,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w5,&andres::defaultOrder,
             (allocator_type *)&permutation_2);
  permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&permutation_2,
             &andres::defaultOrder,(allocator_type *)&local_1e9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&permutation_2,3,&local_1e9);
  begin_04._M_current._4_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_04._M_current._0_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_04._M_current = 0;
  begin_04._M_current[1] = 1;
  begin_04._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w1,begin_04);
  begin_05._M_current._4_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_05._M_current._0_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_05._M_current = 1;
  begin_05._M_current[1] = 0;
  begin_05._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w2,begin_05);
  begin_06._M_current._4_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_06._M_current._0_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_06._M_current = 0;
  begin_06._M_current[1] = 2;
  begin_06._M_current[2] = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&shape,begin_06);
  begin_07._M_current._4_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_07._M_current._0_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_07._M_current = 2;
  begin_07._M_current[1] = 1;
  begin_07._M_current[2] = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&permutation,begin_07);
  begin_08._M_current._4_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_08._M_current._0_4_ =
       permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_08._M_current = 1;
  begin_08._M_current[1] = 2;
  begin_08._M_current[2] = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w5,begin_08);
  for (sVar5 = 0; sVar5 != 3; sVar5 = sVar5 + 1) {
    for (sVar3 = 0; sVar3 != 4; sVar3 = sVar3 + 1) {
      for (sVar4 = 0; sVar4 != 2; sVar4 = sVar4 + 1) {
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar5,sVar3,sVar4);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&w1,sVar5,sVar3,sVar4);
        local_1e9 = (allocator_type)(iVar1 == *piVar2);
        test((bool *)&local_1e9);
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar5,sVar3,sVar4);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&w2,sVar3,sVar5,sVar4);
        local_1e9 = (allocator_type)(iVar1 == *piVar2);
        test((bool *)&local_1e9);
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar5,sVar3,sVar4);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&shape,sVar5,sVar4,
                            sVar3);
        local_1e9 = (allocator_type)(iVar1 == *piVar2);
        test((bool *)&local_1e9);
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar5,sVar3,sVar4);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&permutation,sVar4,
                            sVar3,sVar5);
        local_1e9 = (allocator_type)(iVar1 == *piVar2);
        test((bool *)&local_1e9);
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar5,sVar3,sVar4);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&w5,sVar3,sVar4,sVar5);
        local_1e9 = (allocator_type)(iVar1 == *piVar2);
        test((bool *)&local_1e9);
      }
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&permutation_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w5.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)
             &permutation.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)
             &shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w2.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w1.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void ViewTest::permuteTest() {
    // 2D
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6; 
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_);
        std::vector<std::size_t> permutation(2);
        permutation[0] = 1;
        permutation[1] = 0;
        w1.permute(permutation.begin());
        permutation[0] = 0;
        permutation[1] = 1;
        w2.permute(permutation.begin());

        for(std::size_t x=0; x<6; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                test(v(x, y) == w1(y, x));
                test(v(x, y) == w2(x, y));
            }
        }
    }
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6; 
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        std::vector<std::size_t> permutation(2);
        permutation[0] = 1;
        permutation[1] = 0;
        w1.permute(permutation.begin());
        permutation[0] = 0;
        permutation[1] = 1;
        w2.permute(permutation.begin());

        for(std::size_t x=0; x<6; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                test(v(x, y) == w1(y, x));
                test(v(x, y) == w2(x, y));
            }
        }
    }
    // 3D 
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4;
        shape[2] = 2;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w4(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w5(shape.begin(), shape.end(), data_);
        std::vector<std::size_t> permutation(3);
        permutation[0] = 0;
        permutation[1] = 1; 
        permutation[2] = 2;
        w1.permute(permutation.begin());
        permutation[0] = 1;
        permutation[1] = 0; 
        permutation[2] = 2;
        w2.permute(permutation.begin());
        permutation[0] = 0;
        permutation[1] = 2; 
        permutation[2] = 1;
        w3.permute(permutation.begin());
        permutation[0] = 2;
        permutation[1] = 1; 
        permutation[2] = 0;
        w4.permute(permutation.begin());
        permutation[0] = 1;
        permutation[1] = 2; 
        permutation[2] = 0;
        w5.permute(permutation.begin());

        for(std::size_t x=0; x<3; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                for(std::size_t z=0; z<2; ++z) {
                    test(v(x, y, z) == w1(x, y, z));
                    test(v(x, y, z) == w2(y, x, z));
                    test(v(x, y, z) == w3(x, z, y));
                    test(v(x, y, z) == w4(z, y, x));
                    test(v(x, y, z) == w5(y, z, x));
                }
            }
        }
    }
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4;
        shape[2] = 2;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w4(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w5(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        std::vector<std::size_t> permutation(3);
        permutation[0] = 0;
        permutation[1] = 1; 
        permutation[2] = 2;
        w1.permute(permutation.begin());
        permutation[0] = 1;
        permutation[1] = 0; 
        permutation[2] = 2;
        w2.permute(permutation.begin());
        permutation[0] = 0;
        permutation[1] = 2; 
        permutation[2] = 1;
        w3.permute(permutation.begin());
        permutation[0] = 2;
        permutation[1] = 1; 
        permutation[2] = 0;
        w4.permute(permutation.begin());
        permutation[0] = 1;
        permutation[1] = 2; 
        permutation[2] = 0;
        w5.permute(permutation.begin());

        for(std::size_t x=0; x<3; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                for(std::size_t z=0; z<2; ++z) {
                    test(v(x, y, z) == w1(x, y, z));
                    test(v(x, y, z) == w2(y, x, z));
                    test(v(x, y, z) == w3(x, z, y));
                    test(v(x, y, z) == w4(z, y, x));
                    test(v(x, y, z) == w5(y, z, x));
                }
            }
        }
    }
}